

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int nni_msg_header_insert(nni_msg *m,void *data,size_t len)

{
  int iVar1;
  
  if (m->m_header_len + len < 0x41) {
    memmove((void *)((long)m->m_header_buf + len),m,m->m_header_len);
    memcpy(m,data,len);
    m->m_header_len = m->m_header_len + len;
    iVar1 = 0;
  }
  else {
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int
nni_msg_header_insert(nni_msg *m, const void *data, size_t len)
{
	if ((len + m->m_header_len) > sizeof(m->m_header_buf)) {
		return (NNG_EINVAL);
	}
	memmove(((uint8_t *) m->m_header_buf) + len, m->m_header_buf,
	    m->m_header_len);
	memcpy(m->m_header_buf, data, len);
	m->m_header_len += len;
	return (0);
}